

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

void Vec_WrdDoubleSimInfo(Vec_Wrd_t *p,int nObjs)

{
  int iVar1;
  word *pwVar2;
  ulong uVar3;
  word *__src;
  int iVar4;
  
  iVar4 = p->nSize;
  pwVar2 = (word *)calloc((long)iVar4 * 2,8);
  iVar1 = iVar4 / nObjs;
  if (iVar4 % nObjs == 0) {
    if (0 < nObjs) {
      __src = p->pArray;
      uVar3 = (ulong)(uint)nObjs;
      iVar4 = 0;
      do {
        memcpy(pwVar2 + iVar4,__src,(long)iVar1 * 8);
        __src = __src + iVar1;
        iVar4 = iVar4 + iVar1 * 2;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    if (p->pArray != (word *)0x0) {
      free(p->pArray);
      p->pArray = (word *)0x0;
    }
    p->pArray = pwVar2;
    iVar4 = iVar1 * nObjs * 2;
    p->nCap = iVar4;
    p->nSize = iVar4;
    return;
  }
  __assert_fail("Vec_WrdSize(p) % nObjs == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSim.c"
                ,0x7b,"void Vec_WrdDoubleSimInfo(Vec_Wrd_t *, int)");
}

Assistant:

void Vec_WrdDoubleSimInfo( Vec_Wrd_t * p, int nObjs )
{
    word * pArray = ABC_CALLOC( word, 2 * Vec_WrdSize(p) );
    int i, nWords = Vec_WrdSize(p) / nObjs;
    assert( Vec_WrdSize(p) % nObjs == 0 );
    for ( i = 0; i < nObjs; i++ )
        memcpy( pArray + 2*i*nWords, p->pArray + i*nWords, sizeof(word) * nWords );
    ABC_FREE( p->pArray ); p->pArray = pArray;
    p->nSize = p->nCap = 2*nWords*nObjs;
}